

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall
c4::yml::detail::ReferenceResolver::count_anchors_and_refs(ReferenceResolver *this,size_t n)

{
  Tree *pTVar1;
  NodeType_e NVar2;
  code *pcVar3;
  NodeType_e NVar4;
  NodeType_e NVar5;
  bool bVar6;
  size_t sVar7;
  size_t n_00;
  size_t sVar8;
  
  pTVar1 = this->t;
  if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      sVar7 = (*pcVar3)();
      return sVar7;
    }
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  NVar4 = pTVar1->m_buf[n].m_type.type;
  pTVar1 = this->t;
  if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      sVar7 = (*pcVar3)();
      return sVar7;
    }
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  NVar2 = pTVar1->m_buf[n].m_type.type;
  pTVar1 = this->t;
  if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      sVar7 = (*pcVar3)();
      return sVar7;
    }
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  NVar5 = pTVar1->m_buf[n].m_type.type;
  pTVar1 = this->t;
  if ((n == 0xffffffffffffffff) || (pTVar1->m_cap <= n)) {
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      sVar7 = (*pcVar3)();
      return sVar7;
    }
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  sVar7 = (ulong)((NVar2 & (SEQ|MAP|VAL)) != NOTYPE & (byte)(NVar2 >> 9)) +
          (ulong)((~(int)NVar4 & 0x102U) == 0) + (ulong)(((uint)(int)NVar5 >> 6 & 1) != 0) +
          (ulong)(((uint)(int)pTVar1->m_buf[n].m_type.type >> 7 & 1) != 0);
  for (n_00 = Tree::first_child(this->t,n); n_00 != 0xffffffffffffffff;
      n_00 = Tree::next_sibling(this->t,n_00)) {
    sVar8 = count_anchors_and_refs(this,n_00);
    sVar7 = sVar7 + sVar8;
  }
  return sVar7;
}

Assistant:

size_t count_anchors_and_refs(size_t n)
    {
        size_t c = 0;
        c += t->has_key_anchor(n);
        c += t->has_val_anchor(n);
        c += t->is_key_ref(n);
        c += t->is_val_ref(n);
        for(size_t ch = t->first_child(n); ch != NONE; ch = t->next_sibling(ch))
            c += count_anchors_and_refs(ch);
        return c;
    }